

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O3

bool __thiscall
DNSResolve::DecodeDotStr
          (DNSResolve *this,char *encoded_str,uint16_t *encoded_str_len,char *dot_str,
          uint16_t dot_str_size,char *packet_start_pos)

{
  byte bVar1;
  bool bVar2;
  ulong __n;
  ulong uVar3;
  uint16_t encode_str_len;
  uint16_t local_42;
  DNSResolve *local_40;
  char *local_38;
  
  if (dot_str == (char *)0x0 || (encoded_str_len == (uint16_t *)0x0 || encoded_str == (char *)0x0))
  {
LAB_00111a12:
    bVar2 = false;
  }
  else {
    *encoded_str_len = 0;
    bVar1 = *encoded_str;
    if (bVar1 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      local_40 = this;
      local_38 = packet_start_pos;
      do {
        if (0x3f < bVar1) {
          if (local_38 != (char *)0x0) {
            local_42 = 0;
            bVar2 = DecodeDotStr(local_40,local_38 +
                                          (ushort)((*(ushort *)encoded_str & 0xff3f) << 8 |
                                                  *(ushort *)encoded_str >> 8),&local_42,
                                 dot_str + (uVar3 & 0xffff),dot_str_size - (short)uVar3,local_38);
            if (!bVar2) {
              return bVar2;
            }
            *encoded_str_len = *encoded_str_len + 2;
            return bVar2;
          }
          goto LAB_00111a12;
        }
        __n = (ulong)bVar1;
        if ((uint)dot_str_size <= (uint)bVar1 + (int)(uVar3 & 0xffff)) goto LAB_00111a12;
        memcpy(dot_str + (uVar3 & 0xffff),(char *)((long)encoded_str + 1),__n);
        (dot_str + (uVar3 & 0xffff))[__n] = '.';
        encoded_str = (char *)((long)encoded_str + __n + 1);
        *encoded_str_len = *encoded_str_len + (short)(__n + 1);
        uVar3 = (ulong)(uint)((int)(__n + 1) + (int)uVar3);
        bVar1 = (byte)*(ushort *)encoded_str;
      } while (bVar1 != 0);
      uVar3 = uVar3 & 0xffff;
    }
    dot_str[uVar3 - 1] = '\0';
    *encoded_str_len = *encoded_str_len + 1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool DNSResolve::DecodeDotStr(
    char *encoded_str,
    uint16_t *encoded_str_len,
    char *dot_str,
    uint16_t dot_str_size,
    char *packet_start_pos)
{
    if (encoded_str == NULL || encoded_str_len == NULL || dot_str == NULL)
    {
        return false;
    }

    char *decode_pos = encoded_str;
    uint16_t plain_str_len = 0;
    uint8_t label_data_len = 0;
    *encoded_str_len = 0;

    while ((label_data_len = *decode_pos) != 0x00)
    {
        if ((label_data_len & 0xc0) == 0)   //normal mode��LabelDataLen + Label
        {
            if (plain_str_len + label_data_len + 1 > dot_str_size)
            {
                return false;
            }
            memcpy(dot_str + plain_str_len, decode_pos + 1, label_data_len);
            memcpy(dot_str + plain_str_len + label_data_len, ".", 1);
            decode_pos += (label_data_len + 1);
            plain_str_len += (label_data_len + 1);
            *encoded_str_len += (label_data_len + 1);
        }
        else
        {
            //compression scheme��11000000 00000000��
            //first two bits are ones��next is OFFSET field
            if (packet_start_pos == NULL)
            {
                return false;
            }
            uint16_t jump_pos = ntohs(*(uint16_t*)(decode_pos)) & 0x3fff;
            uint16_t encode_str_len = 0;
            if (!DecodeDotStr(packet_start_pos + jump_pos, &encode_str_len,
                              dot_str + plain_str_len, dot_str_size - plain_str_len,
                              packet_start_pos))
            {
                return false;
            }
            else
            {
                *encoded_str_len += 2;
                return true;
            }
        }
    }

    dot_str[plain_str_len - 1] = '\0';
    *encoded_str_len += 1;

    return true;
}